

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf-test.cc
# Opt level: O0

void __thiscall PrintfTest_Width_Test::~PrintfTest_Width_Test(PrintfTest_Width_Test *this)

{
  void *in_RDI;
  
  ~PrintfTest_Width_Test((PrintfTest_Width_Test *)0x140868);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(PrintfTest, Width) {
  EXPECT_PRINTF("  abc", "%5s", "abc");

  // Width cannot be specified twice.
  EXPECT_THROW_MSG(test_sprintf("%5-5d", 42), format_error,
      "invalid type specifier");

  EXPECT_THROW_MSG(test_sprintf(format("%{}d", BIG_NUM), 42),
      format_error, "number is too big");
  EXPECT_THROW_MSG(test_sprintf(format("%1${}d", BIG_NUM), 42),
      format_error, "number is too big");
}